

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

bool __thiscall
testing::internal::
CartesianProductGenerator<libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>,_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::AtEnd
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this)

{
  bool bVar1;
  
  bVar1 = ParamIterator<libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>_>
          ::operator==(&(this->current_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>_>,_testing::internal::ParamIterator<int>_>
                        .
                        super__Head_base<0UL,_testing::internal::ParamIterator<libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>_>,_false>
                        ._M_head_impl,
                       &(this->end_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>_>,_testing::internal::ParamIterator<int>_>
                        .
                        super__Head_base<0UL,_testing::internal::ParamIterator<libaom_test::FuncParam<void_(*)(const_yv12_buffer_config_*,_const_macroblockd_*,_BLOCK_SIZE,_int,_int,_int,_const_double_*,_const_mv_*,_const_int_*,_int,_int,_int,_const_unsigned_char_*,_unsigned_int_*,_unsigned_short_*)>_>,_false>
                        ._M_head_impl);
  if (bVar1) {
    return true;
  }
  bVar1 = ParamIterator<int>::operator==
                    ((ParamIterator<int> *)&this->current_,(ParamIterator<int> *)&this->end_);
  return bVar1;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }